

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

bool RigidBodyDynamics::isConstrainedSystemFullyActuated
               (Model *model,VectorNd *Q,VectorNd *QDot,ConstraintSet *CS,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  long lVar1;
  int iVar2;
  ConstraintSet *Tau;
  double *pdVar3;
  Index othersize;
  RhsNested rows;
  double dVar4;
  assign_op<double,_double> local_59;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_58;
  undefined8 local_48;
  undefined8 local_40;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *local_38;
  
  local_40 = *(undefined8 *)(CS + 0x168);
  local_48 = *(undefined8 *)(CS + 0x1f0);
  rows.m_matrix =
       (non_const_type)
       (QDot->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_58.m_lhs = (LhsNested)0x0;
  local_58.m_rhs.m_matrix = (non_const_type)0x0;
  Tau = CS;
  local_38 = f_ext;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_58,
             (Index)rows.m_matrix,1);
  if (local_58.m_rhs.m_matrix != rows.m_matrix) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_58,
               (Index)rows.m_matrix,1);
    rows.m_matrix = local_58.m_rhs.m_matrix;
  }
  if (0 < (long)rows.m_matrix) {
    memset(local_58.m_lhs,0,(long)rows.m_matrix << 3);
  }
  CalcConstrainedSystemVariables(model,Q,QDot,(VectorNd *)Tau,CS,update_kinematics,local_38);
  free(local_58.m_lhs);
  local_58.m_lhs = (LhsNested)(CS + 0x198);
  local_58.m_rhs.m_matrix = (non_const_type)(CS + 0x200);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)(CS + 0x470),&local_58,&local_59,(type)0x0);
  Eigen::FullPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((FullPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(CS + 0x3c0),
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(CS + 0x470));
  if (CS[0x429] == (ConstraintSet)0x1) {
    dVar4 = *(double *)(CS + 0x430);
  }
  else {
    lVar1 = *(long *)(CS + 0x3c8);
    if (*(long *)(CS + 0x3d0) < *(long *)(CS + 0x3c8)) {
      lVar1 = *(long *)(CS + 0x3d0);
    }
    dVar4 = (double)lVar1 * 2.220446049250313e-16;
  }
  lVar1 = *(long *)(CS + 0x440);
  if (lVar1 < 1) {
    iVar2 = 0;
  }
  else {
    pdVar3 = *(double **)(CS + 0x3c0);
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)(ABS(*(double *)(CS + 0x438)) * dVar4 < ABS(*pdVar3));
      pdVar3 = pdVar3 + *(long *)(CS + 0x3c8) + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return (int)local_40 - (int)local_48 == iVar2;
}

Assistant:

RBDL_DLLAPI
bool isConstrainedSystemFullyActuated(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  ConstraintSet &CS,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext)
{

  LOG << "-------- " << __func__ << " ------" << std::endl;


  assert (CS.S.cols()    == QDot.rows());

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;


  CalcConstrainedSystemVariables(model,Q,QDot,VectorNd::Zero(QDot.rows()),CS,
                                 update_kinematics, f_ext);

  CS.GPT = CS.G*CS.P.transpose();

  CS.GPT_full_qr.compute(CS.GPT);
  unsigned int r = unsigned(CS.GPT_full_qr.rank());

  bool isCompatible = false;
  if(r == (n-na)) {
    isCompatible = true;
  } else {
    isCompatible = false;
  }

  return isCompatible;

}